

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::Vector::Encode(Vector *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Vector *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(float)this->m_f32X);
  pKVar1 = KDataStream::operator<<(pKVar1,(float)this->m_f32Y);
  KDataStream::operator<<(pKVar1,(float)this->m_f32Z);
  return;
}

Assistant:

void Vector::Encode( KDataStream & stream ) const
{
    stream << m_f32X
           << m_f32Y
           << m_f32Z;
}